

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::UniformBlockTests::init(UniformBlockTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  Context *pCVar2;
  _func_int **pp_Var3;
  int iVar4;
  undefined8 uVar5;
  int extraout_EAX;
  TestNode *pTVar6;
  TestNode *pTVar7;
  TestNode *pTVar8;
  anon_struct_16_2_f7718127 *paVar9;
  long *plVar10;
  char *pcVar11;
  UniformBlockCase *pUVar12;
  long *plVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  int isArray;
  int iVar17;
  uint uVar18;
  bool bVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string baseName;
  VarType local_148;
  long lStack_130;
  TestNode *local_128;
  VarType local_120;
  long lStack_108;
  TestNode *local_100;
  TestNode *local_f8;
  TestNode *local_f0;
  TestNode *local_e8;
  TestNode *local_e0;
  anon_struct_16_2_f7718127 *local_d8;
  TestNode *local_d0;
  TestNode *local_c8;
  TestNode *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  allocator<char> local_91;
  VarType local_90;
  long lStack_78;
  long local_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  VarType local_48;
  
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_basic_type","Single basic variable in single buffer");
  local_c8 = pTVar6;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  lVar16 = 0;
  local_e8 = (TestNode *)this;
  do {
    pTVar6 = local_e8;
    pTVar7 = (TestNode *)operator_new(0x70);
    local_c0 = (TestNode *)lVar16;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar7,pTVar6->m_testCtx,init::layoutFlags[lVar16].name,
               glcts::fixed_sample_locations_values + 1);
    local_f0 = pTVar7;
    tcu::TestNode::addChild(local_c8,pTVar7);
    lVar14 = 0;
    local_100 = (TestNode *)(init::layoutFlags + lVar16);
    do {
      pTVar7 = local_100;
      DVar1 = init::basicTypes[lVar14];
      local_d0 = (TestNode *)lVar14;
      pTVar8 = (TestNode *)glu::getDataTypeName(DVar1);
      local_128 = (TestNode *)(ulong)DVar1;
      local_f8 = pTVar8;
      if (DVar1 - TYPE_BOOL < 4) {
        pCVar2 = (Context *)pTVar6[1]._vptr_TestNode;
        deqp::gls::ub::VarType::VarType(&local_120,DVar1,0);
        createBlockBasicTypeCases
                  ((TestCaseGroup *)local_f0,pCVar2,(char *)pTVar8,&local_120,
                   *(deUint32 *)&pTVar7->m_testCtx,0);
        deqp::gls::ub::VarType::~VarType(&local_120);
      }
      else {
        lVar16 = 8;
        do {
          pCVar2 = (Context *)pTVar6[1]._vptr_TestNode;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,*(char **)(&UNK_0217cf88 + lVar16),
                     (allocator<char> *)local_68);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_b8);
          local_148._0_8_ = (long)&local_148 + 0x10;
          plVar13 = plVar10 + 2;
          if ((long *)*plVar10 == plVar13) {
            local_148.m_data._8_8_ = *plVar13;
            lStack_130 = plVar10[3];
          }
          else {
            local_148.m_data._8_8_ = *plVar13;
            local_148._0_8_ = (long *)*plVar10;
          }
          local_148.m_data.array.elementType = (VarType *)plVar10[1];
          *plVar10 = (long)plVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_148);
          local_120._0_8_ = (long)&local_120 + 0x10;
          plVar13 = plVar10 + 2;
          if ((long *)*plVar10 == plVar13) {
            local_120.m_data._8_8_ = *plVar13;
            lStack_108 = plVar10[3];
          }
          else {
            local_120.m_data._8_8_ = *plVar13;
            local_120._0_8_ = (long *)*plVar10;
          }
          uVar5 = local_120._0_8_;
          local_120.m_data.array.elementType = (VarType *)plVar10[1];
          *plVar10 = (long)plVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          deqp::gls::ub::VarType::VarType
                    (&local_90,(DataType)local_128,
                     *(deUint32 *)((long)&init::precisionFlags[0].name + lVar16));
          createBlockBasicTypeCases
                    ((TestCaseGroup *)local_f0,pCVar2,(char *)uVar5,&local_90,
                     *(deUint32 *)&local_100->m_testCtx,0);
          deqp::gls::ub::VarType::~VarType(&local_90);
          if (local_120._0_8_ != (long)&local_120 + 0x10U) {
            operator_delete((void *)local_120._0_8_,local_120.m_data._8_8_ + 1);
          }
          if (local_148._0_8_ != (long)&local_148 + 0x10U) {
            operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,local_a8 + 1);
          }
          lVar16 = lVar16 + 0x10;
        } while (lVar16 != 0x38);
      }
      if ((int)local_128 - 5U < 9 || (int)local_128 - 0x12U < 9) {
        paVar9 = (anon_struct_16_2_f7718127 *)0x0;
        do {
          local_d8 = init::matrixFlags + (long)paVar9;
          pcVar11 = init::matrixFlags[(long)paVar9].name;
          lVar16 = 8;
          local_e0 = (TestNode *)paVar9;
          do {
            pCVar2 = (Context *)local_e8[1]._vptr_TestNode;
            std::__cxx11::string::string<std::allocator<char>>((string *)local_68,pcVar11,&local_91)
            ;
            plVar10 = (long *)std::__cxx11::string::append((char *)local_68);
            plVar13 = plVar10 + 2;
            if ((long *)*plVar10 == plVar13) {
              local_90.m_data._8_8_ = *plVar13;
              lStack_78 = plVar10[3];
              local_90._0_8_ = (long)&local_90 + 0x10;
            }
            else {
              local_90.m_data._8_8_ = *plVar13;
              local_90._0_8_ = (long *)*plVar10;
            }
            local_90.m_data.array.elementType = (VarType *)plVar10[1];
            *plVar10 = (long)plVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_90);
            local_b8 = &local_a8;
            plVar13 = plVar10 + 2;
            if ((long *)*plVar10 == plVar13) {
              local_a8 = *plVar13;
              lStack_a0 = plVar10[3];
            }
            else {
              local_a8 = *plVar13;
              local_b8 = (long *)*plVar10;
            }
            local_b0 = plVar10[1];
            *plVar10 = (long)plVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_b8);
            local_148._0_8_ = (long)&local_148 + 0x10;
            plVar13 = plVar10 + 2;
            if ((long *)*plVar10 == plVar13) {
              local_148.m_data._8_8_ = *plVar13;
              lStack_130 = plVar10[3];
            }
            else {
              local_148.m_data._8_8_ = *plVar13;
              local_148._0_8_ = (long *)*plVar10;
            }
            local_148.m_data.array.elementType = (VarType *)plVar10[1];
            *plVar10 = (long)plVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_148);
            local_120._0_8_ = (long)&local_120 + 0x10;
            plVar13 = plVar10 + 2;
            if ((long *)*plVar10 == plVar13) {
              local_120.m_data._8_8_ = *plVar13;
              lStack_108 = plVar10[3];
            }
            else {
              local_120.m_data._8_8_ = *plVar13;
              local_120._0_8_ = (long *)*plVar10;
            }
            uVar5 = local_120._0_8_;
            local_120.m_data.array.elementType = (VarType *)plVar10[1];
            *plVar10 = (long)plVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            deqp::gls::ub::VarType::VarType
                      (&local_48,(DataType)local_128,
                       *(deUint32 *)((long)&init::precisionFlags[0].name + lVar16));
            createBlockBasicTypeCases
                      ((TestCaseGroup *)local_f0,pCVar2,(char *)uVar5,&local_48,
                       local_d8->flags | *(uint *)&local_100->m_testCtx,0);
            deqp::gls::ub::VarType::~VarType(&local_48);
            if (local_120._0_8_ != (long)&local_120 + 0x10U) {
              operator_delete((void *)local_120._0_8_,local_120.m_data._8_8_ + 1);
            }
            if (local_148._0_8_ != (long)&local_148 + 0x10U) {
              operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
            }
            if (local_b8 != &local_a8) {
              operator_delete(local_b8,local_a8 + 1);
            }
            if (local_90._0_8_ != (long)&local_90 + 0x10U) {
              operator_delete((void *)local_90._0_8_,local_90.m_data._8_8_ + 1);
            }
            if (local_68[0] != (undefined1 *)((long)&((VarType *)local_68)->m_data + 8U)) {
              operator_delete(local_68[0],local_58._0_8_ + 1);
            }
            lVar16 = lVar16 + 0x10;
          } while (lVar16 != 0x38);
          paVar9 = (anon_struct_16_2_f7718127 *)((long)&local_e0->_vptr_TestNode + 1);
        } while (local_e0 == (TestNode *)0x0);
      }
      pTVar6 = local_e8;
      lVar14 = (long)local_d0 + 1;
    } while (lVar14 != 0x19);
    lVar16 = (long)local_c0 + 1;
  } while (lVar16 != 3);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pTVar6->m_testCtx,"single_basic_array",
             "Single basic array variable in single buffer");
  tcu::TestNode::addChild(pTVar6,pTVar7);
  paVar9 = (anon_struct_16_2_f7718127 *)0x0;
  local_d0 = pTVar7;
  do {
    pTVar7 = local_d0;
    pTVar8 = (TestNode *)operator_new(0x70);
    local_e0 = (TestNode *)paVar9;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar6->m_testCtx,init::layoutFlags[(long)paVar9].name,
               glcts::fixed_sample_locations_values + 1);
    local_d8 = init::layoutFlags + (long)paVar9;
    local_100 = pTVar8;
    tcu::TestNode::addChild(pTVar7,pTVar8);
    pTVar7 = (TestNode *)0x0;
    do {
      DVar1 = init::basicTypes[(long)pTVar7];
      local_f0 = pTVar7;
      pcVar11 = glu::getDataTypeName(DVar1);
      pCVar2 = (Context *)pTVar6[1]._vptr_TestNode;
      local_128 = (TestNode *)(ulong)DVar1;
      deqp::gls::ub::VarType::VarType(&local_148,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2);
      deqp::gls::ub::VarType::VarType(&local_120,&local_148,3);
      local_f8 = (TestNode *)CONCAT44(local_f8._4_4_,local_d8->flags);
      createBlockBasicTypeCases
                ((TestCaseGroup *)local_100,pCVar2,pcVar11,&local_120,local_d8->flags,0);
      deqp::gls::ub::VarType::~VarType(&local_120);
      deqp::gls::ub::VarType::~VarType(&local_148);
      if ((int)local_128 - 5U < 9 || (int)local_128 - 0x12U < 9) {
        lVar16 = 0;
        do {
          pCVar2 = (Context *)local_e8[1]._vptr_TestNode;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,*(char **)((long)&init::matrixFlags[0].name + lVar16),
                     (allocator<char> *)&local_48);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_b8);
          local_148._0_8_ = (long)&local_148 + 0x10;
          plVar13 = plVar10 + 2;
          if ((long *)*plVar10 == plVar13) {
            local_148.m_data._8_8_ = *plVar13;
            lStack_130 = plVar10[3];
          }
          else {
            local_148.m_data._8_8_ = *plVar13;
            local_148._0_8_ = (long *)*plVar10;
          }
          local_148.m_data.array.elementType = (VarType *)plVar10[1];
          *plVar10 = (long)plVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_148);
          local_120._0_8_ = (long)&local_120 + 0x10;
          plVar13 = plVar10 + 2;
          if ((long *)*plVar10 == plVar13) {
            local_120.m_data._8_8_ = *plVar13;
            lStack_108 = plVar10[3];
          }
          else {
            local_120.m_data._8_8_ = *plVar13;
            local_120._0_8_ = (long *)*plVar10;
          }
          uVar5 = local_120._0_8_;
          local_120.m_data.array.elementType = (VarType *)plVar10[1];
          *plVar10 = (long)plVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          deqp::gls::ub::VarType::VarType((VarType *)local_68,(DataType)local_128,4);
          deqp::gls::ub::VarType::VarType(&local_90,(VarType *)local_68,3);
          createBlockBasicTypeCases
                    ((TestCaseGroup *)local_100,pCVar2,(char *)uVar5,&local_90,
                     *(uint *)((long)&init::matrixFlags[0].flags + lVar16) | (BufferMode)local_f8,0)
          ;
          deqp::gls::ub::VarType::~VarType(&local_90);
          deqp::gls::ub::VarType::~VarType((VarType *)local_68);
          if (local_120._0_8_ != (long)&local_120 + 0x10U) {
            operator_delete((void *)local_120._0_8_,local_120.m_data._8_8_ + 1);
          }
          if (local_148._0_8_ != (long)&local_148 + 0x10U) {
            operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,local_a8 + 1);
          }
          lVar16 = lVar16 + 0x10;
        } while (lVar16 == 0x10);
      }
      pTVar6 = local_e8;
      pTVar7 = (TestNode *)((long)&local_f0->_vptr_TestNode + 1);
    } while (pTVar7 != (TestNode *)0x19);
    paVar9 = (anon_struct_16_2_f7718127 *)((long)&local_e0->_vptr_TestNode + 1);
  } while (paVar9 != (anon_struct_16_2_f7718127 *)0x3);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pTVar6->m_testCtx,"single_struct",
             "Single struct in uniform block");
  tcu::TestNode::addChild(pTVar6,pTVar7);
  lVar16 = 0;
  local_c8 = pTVar7;
  do {
    pTVar7 = local_c8;
    pTVar8 = (TestNode *)operator_new(0x70);
    local_c0 = (TestNode *)lVar16;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar6->m_testCtx,init::bufferModes[lVar16].name,
               glcts::fixed_sample_locations_values + 1);
    local_d8 = (anon_struct_16_2_f7718127 *)(init::bufferModes + lVar16);
    tcu::TestNode::addChild(pTVar7,pTVar8);
    pTVar7 = (TestNode *)0x0;
    local_f8 = pTVar8;
    do {
      local_e0 = (TestNode *)(init::layoutFlags + (long)pTVar7);
      local_f0 = (TestNode *)init::layoutFlags[(long)pTVar7].name;
      iVar17 = 0;
      local_d0 = pTVar7;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,(char *)local_f0,(allocator<char> *)&local_148);
        local_100 = (TestNode *)CONCAT44(local_100._4_4_,local_d8->flags);
        if (local_d8->flags != 0 || iVar17 != 0) {
          local_128 = (TestNode *)CONCAT44(local_128._4_4_,*(deUint32 *)&local_e0->m_testCtx);
          if (iVar17 != 0) {
            std::__cxx11::string::append((char *)&local_120);
          }
          pUVar12 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var3 = pTVar6[1]._vptr_TestNode;
          local_148._0_8_ = (long)&local_148 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_120._0_8_,
                     (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_148);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                     (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                     GLSL_VERSION_300_ES,(BufferMode)local_100);
          iVar4 = (uint)(iVar17 != 0) * 3;
          (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0217d0a8;
          *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_128 | 0x100;
          *(int *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar12);
          pTVar6 = local_e8;
          if (local_148._0_8_ != (long)&local_148 + 0x10U) {
            operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
          }
          pUVar12 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var3 = pTVar6[1]._vptr_TestNode;
          local_148._0_8_ = (long)&local_148 + 0x10U;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_120._0_8_,
                     (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_148);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                     (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                     GLSL_VERSION_300_ES,(BufferMode)local_100);
          (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0217d0a8;
          *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_128 | 0x200;
          *(int *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar12);
          if (local_148._0_8_ != (long)&local_148 + 0x10U) {
            operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
          }
          if (((ulong)local_128 & 0x10) == 0) {
            pUVar12 = (UniformBlockCase *)operator_new(0xb8);
            pp_Var3 = pTVar6[1]._vptr_TestNode;
            local_148._0_8_ = (long)&local_148 + 0x10U;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_148,local_120._0_8_,
                       (char *)(local_120._0_8_ +
                               (long)&(local_120.m_data.array.elementType)->m_type));
            std::__cxx11::string::append((char *)&local_148);
            deqp::gls::UniformBlockCase::UniformBlockCase
                      (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                       (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                       GLSL_VERSION_300_ES,(BufferMode)local_100);
            (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__UniformBlockCase_0217d0a8;
            *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode =
                 (uint)local_128 | 0x300;
            *(int *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
            tcu::TestNode::addChild(local_f8,(TestNode *)pUVar12);
            if (local_148._0_8_ != (long)&local_148 + 0x10U) {
              operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
            }
          }
        }
        if (local_120._0_8_ != (long)&local_120 + 0x10U) {
          operator_delete((void *)local_120._0_8_,local_120.m_data._8_8_ + 1);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 == 1);
      pTVar7 = (TestNode *)((long)&local_d0->_vptr_TestNode + 1);
    } while (pTVar7 != (TestNode *)0x3);
    lVar16 = (long)local_c0 + 1;
  } while (local_c0 == (TestNode *)0x0);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pTVar6->m_testCtx,"single_struct_array",
             "Struct array in one uniform block");
  tcu::TestNode::addChild(pTVar6,pTVar7);
  lVar16 = 0;
  local_c8 = pTVar7;
  do {
    pTVar7 = local_c8;
    pTVar8 = (TestNode *)operator_new(0x70);
    local_c0 = (TestNode *)lVar16;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar6->m_testCtx,init::bufferModes[lVar16].name,
               glcts::fixed_sample_locations_values + 1);
    local_d8 = (anon_struct_16_2_f7718127 *)(init::bufferModes + lVar16);
    tcu::TestNode::addChild(pTVar7,pTVar8);
    pTVar7 = (TestNode *)0x0;
    local_f8 = pTVar8;
    do {
      local_e0 = (TestNode *)(init::layoutFlags + (long)pTVar7);
      local_f0 = (TestNode *)init::layoutFlags[(long)pTVar7].name;
      iVar17 = 0;
      local_d0 = pTVar7;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,(char *)local_f0,(allocator<char> *)&local_148);
        local_100 = (TestNode *)CONCAT44(local_100._4_4_,local_d8->flags);
        if (local_d8->flags != 0 || iVar17 != 0) {
          local_128 = (TestNode *)CONCAT44(local_128._4_4_,*(deUint32 *)&local_e0->m_testCtx);
          if (iVar17 != 0) {
            std::__cxx11::string::append((char *)&local_120);
          }
          pUVar12 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var3 = pTVar6[1]._vptr_TestNode;
          local_148._0_8_ = (long)&local_148 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_120._0_8_,
                     (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_148);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                     (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                     GLSL_VERSION_300_ES,(BufferMode)local_100);
          iVar4 = (uint)(iVar17 != 0) * 3;
          (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0217d0f8;
          *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_128 | 0x100;
          *(int *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar12);
          pTVar6 = local_e8;
          if (local_148._0_8_ != (long)&local_148 + 0x10U) {
            operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
          }
          pUVar12 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var3 = pTVar6[1]._vptr_TestNode;
          local_148._0_8_ = (long)&local_148 + 0x10U;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_120._0_8_,
                     (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_148);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                     (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                     GLSL_VERSION_300_ES,(BufferMode)local_100);
          (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0217d0f8;
          *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_128 | 0x200;
          *(int *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar12);
          if (local_148._0_8_ != (long)&local_148 + 0x10U) {
            operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
          }
          if (((ulong)local_128 & 0x10) == 0) {
            pUVar12 = (UniformBlockCase *)operator_new(0xb8);
            pp_Var3 = pTVar6[1]._vptr_TestNode;
            local_148._0_8_ = (long)&local_148 + 0x10U;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_148,local_120._0_8_,
                       (char *)(local_120._0_8_ +
                               (long)&(local_120.m_data.array.elementType)->m_type));
            std::__cxx11::string::append((char *)&local_148);
            deqp::gls::UniformBlockCase::UniformBlockCase
                      (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                       (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                       GLSL_VERSION_300_ES,(BufferMode)local_100);
            (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__UniformBlockCase_0217d0f8;
            *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode =
                 (uint)local_128 | 0x300;
            *(int *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
            tcu::TestNode::addChild(local_f8,(TestNode *)pUVar12);
            if (local_148._0_8_ != (long)&local_148 + 0x10U) {
              operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
            }
          }
        }
        if (local_120._0_8_ != (long)&local_120 + 0x10U) {
          operator_delete((void *)local_120._0_8_,local_120.m_data._8_8_ + 1);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 == 1);
      pTVar7 = (TestNode *)((long)&local_d0->_vptr_TestNode + 1);
    } while (pTVar7 != (TestNode *)0x3);
    lVar16 = (long)local_c0 + 1;
  } while (local_c0 == (TestNode *)0x0);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pTVar6->m_testCtx,"single_nested_struct",
             "Nested struct in one uniform block");
  tcu::TestNode::addChild(pTVar6,pTVar7);
  lVar16 = 0;
  local_c8 = pTVar7;
  do {
    pTVar7 = local_c8;
    pTVar8 = (TestNode *)operator_new(0x70);
    local_c0 = (TestNode *)lVar16;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar6->m_testCtx,init::bufferModes[lVar16].name,
               glcts::fixed_sample_locations_values + 1);
    local_d8 = (anon_struct_16_2_f7718127 *)(init::bufferModes + lVar16);
    tcu::TestNode::addChild(pTVar7,pTVar8);
    pTVar7 = (TestNode *)0x0;
    local_f8 = pTVar8;
    do {
      local_e0 = (TestNode *)(init::layoutFlags + (long)pTVar7);
      local_f0 = (TestNode *)init::layoutFlags[(long)pTVar7].name;
      iVar17 = 0;
      local_d0 = pTVar7;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,(char *)local_f0,(allocator<char> *)&local_148);
        local_100 = (TestNode *)CONCAT44(local_100._4_4_,local_d8->flags);
        if (local_d8->flags != 0 || iVar17 != 0) {
          local_128 = (TestNode *)CONCAT44(local_128._4_4_,*(deUint32 *)&local_e0->m_testCtx);
          if (iVar17 != 0) {
            std::__cxx11::string::append((char *)&local_120);
          }
          pUVar12 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var3 = pTVar6[1]._vptr_TestNode;
          local_148._0_8_ = (long)&local_148 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_120._0_8_,
                     (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_148);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                     (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                     GLSL_VERSION_300_ES,(BufferMode)local_100);
          iVar4 = (uint)(iVar17 != 0) * 3;
          (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0217d148;
          *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_128 | 0x100;
          *(int *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar12);
          pTVar6 = local_e8;
          if (local_148._0_8_ != (long)&local_148 + 0x10U) {
            operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
          }
          pUVar12 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var3 = pTVar6[1]._vptr_TestNode;
          local_148._0_8_ = (long)&local_148 + 0x10U;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_120._0_8_,
                     (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_148);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                     (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                     GLSL_VERSION_300_ES,(BufferMode)local_100);
          (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0217d148;
          *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_128 | 0x200;
          *(int *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar12);
          if (local_148._0_8_ != (long)&local_148 + 0x10U) {
            operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
          }
          if (((ulong)local_128 & 0x10) == 0) {
            pUVar12 = (UniformBlockCase *)operator_new(0xb8);
            pp_Var3 = pTVar6[1]._vptr_TestNode;
            local_148._0_8_ = (long)&local_148 + 0x10U;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_148,local_120._0_8_,
                       (char *)(local_120._0_8_ +
                               (long)&(local_120.m_data.array.elementType)->m_type));
            std::__cxx11::string::append((char *)&local_148);
            deqp::gls::UniformBlockCase::UniformBlockCase
                      (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                       (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                       GLSL_VERSION_300_ES,(BufferMode)local_100);
            (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__UniformBlockCase_0217d148;
            *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode =
                 (uint)local_128 | 0x300;
            *(int *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
            tcu::TestNode::addChild(local_f8,(TestNode *)pUVar12);
            if (local_148._0_8_ != (long)&local_148 + 0x10U) {
              operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
            }
          }
        }
        if (local_120._0_8_ != (long)&local_120 + 0x10U) {
          operator_delete((void *)local_120._0_8_,local_120.m_data._8_8_ + 1);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 == 1);
      pTVar7 = (TestNode *)((long)&local_d0->_vptr_TestNode + 1);
    } while (pTVar7 != (TestNode *)0x3);
    lVar16 = (long)local_c0 + 1;
  } while (local_c0 == (TestNode *)0x0);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pTVar6->m_testCtx,"single_nested_struct_array",
             "Nested struct array in one uniform block");
  tcu::TestNode::addChild(pTVar6,pTVar7);
  lVar16 = 0;
  local_c8 = pTVar7;
  do {
    pTVar7 = local_c8;
    pTVar8 = (TestNode *)operator_new(0x70);
    local_c0 = (TestNode *)lVar16;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar6->m_testCtx,init::bufferModes[lVar16].name,
               glcts::fixed_sample_locations_values + 1);
    local_d8 = (anon_struct_16_2_f7718127 *)(init::bufferModes + lVar16);
    tcu::TestNode::addChild(pTVar7,pTVar8);
    pTVar7 = (TestNode *)0x0;
    local_f8 = pTVar8;
    do {
      local_e0 = (TestNode *)(init::layoutFlags + (long)pTVar7);
      local_f0 = (TestNode *)init::layoutFlags[(long)pTVar7].name;
      iVar17 = 0;
      local_d0 = pTVar7;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,(char *)local_f0,(allocator<char> *)&local_148);
        local_100 = (TestNode *)CONCAT44(local_100._4_4_,local_d8->flags);
        if (local_d8->flags != 0 || iVar17 != 0) {
          local_128 = (TestNode *)CONCAT44(local_128._4_4_,*(deUint32 *)&local_e0->m_testCtx);
          if (iVar17 != 0) {
            std::__cxx11::string::append((char *)&local_120);
          }
          pUVar12 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var3 = pTVar6[1]._vptr_TestNode;
          local_148._0_8_ = (long)&local_148 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_120._0_8_,
                     (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_148);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                     (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                     GLSL_VERSION_300_ES,(BufferMode)local_100);
          iVar4 = (uint)(iVar17 != 0) * 3;
          (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0217d198;
          *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_128 | 0x100;
          *(int *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar12);
          pTVar6 = local_e8;
          if (local_148._0_8_ != (long)&local_148 + 0x10U) {
            operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
          }
          pUVar12 = (UniformBlockCase *)operator_new(0xb8);
          pp_Var3 = pTVar6[1]._vptr_TestNode;
          local_148._0_8_ = (long)&local_148 + 0x10U;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_120._0_8_,
                     (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_148);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                     (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                     GLSL_VERSION_300_ES,(BufferMode)local_100);
          (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0217d198;
          *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_128 | 0x200;
          *(int *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
          tcu::TestNode::addChild(local_f8,(TestNode *)pUVar12);
          if (local_148._0_8_ != (long)&local_148 + 0x10U) {
            operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
          }
          if (((ulong)local_128 & 0x10) == 0) {
            pUVar12 = (UniformBlockCase *)operator_new(0xb8);
            pp_Var3 = pTVar6[1]._vptr_TestNode;
            local_148._0_8_ = (long)&local_148 + 0x10U;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_148,local_120._0_8_,
                       (char *)(local_120._0_8_ +
                               (long)&(local_120.m_data.array.elementType)->m_type));
            std::__cxx11::string::append((char *)&local_148);
            deqp::gls::UniformBlockCase::UniformBlockCase
                      (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                       (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                       GLSL_VERSION_300_ES,(BufferMode)local_100);
            (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__UniformBlockCase_0217d198;
            *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode =
                 (uint)local_128 | 0x300;
            *(int *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
            tcu::TestNode::addChild(local_f8,(TestNode *)pUVar12);
            if (local_148._0_8_ != (long)&local_148 + 0x10U) {
              operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
            }
          }
        }
        if (local_120._0_8_ != (long)&local_120 + 0x10U) {
          operator_delete((void *)local_120._0_8_,local_120.m_data._8_8_ + 1);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 == 1);
      pTVar7 = (TestNode *)((long)&local_d0->_vptr_TestNode + 1);
    } while (pTVar7 != (TestNode *)0x3);
    lVar16 = (long)local_c0 + 1;
  } while (local_c0 == (TestNode *)0x0);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pTVar6->m_testCtx,"instance_array_basic_type",
             "Single basic variable in instance array");
  tcu::TestNode::addChild(pTVar6,pTVar7);
  paVar9 = (anon_struct_16_2_f7718127 *)0x0;
  local_e0 = pTVar7;
  do {
    pTVar7 = local_e0;
    pTVar8 = (TestNode *)operator_new(0x70);
    local_d8 = paVar9;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar6->m_testCtx,init::layoutFlags[(long)paVar9].name,
               glcts::fixed_sample_locations_values + 1);
    local_f0 = (TestNode *)(init::layoutFlags + (long)paVar9);
    local_128 = pTVar8;
    tcu::TestNode::addChild(pTVar7,pTVar8);
    pTVar6 = (TestNode *)0x0;
    do {
      DVar1 = init::basicTypes[(long)pTVar6];
      local_f8 = pTVar6;
      pTVar6 = (TestNode *)glu::getDataTypeName(DVar1);
      pCVar2 = (Context *)local_e8[1]._vptr_TestNode;
      deqp::gls::ub::VarType::VarType(&local_120,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2);
      uVar18 = *(uint *)&local_f0->m_testCtx;
      local_100 = pTVar6;
      createBlockBasicTypeCases
                ((TestCaseGroup *)local_128,pCVar2,(char *)pTVar6,&local_120,uVar18,3);
      deqp::gls::ub::VarType::~VarType(&local_120);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        lVar16 = 0;
        do {
          pCVar2 = (Context *)local_e8[1]._vptr_TestNode;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,*(char **)((long)&init::matrixFlags[0].name + lVar16),
                     (allocator<char> *)local_68);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_b8);
          local_148._0_8_ = (long)&local_148 + 0x10;
          plVar13 = plVar10 + 2;
          if ((long *)*plVar10 == plVar13) {
            local_148.m_data._8_8_ = *plVar13;
            lStack_130 = plVar10[3];
          }
          else {
            local_148.m_data._8_8_ = *plVar13;
            local_148._0_8_ = (long *)*plVar10;
          }
          local_148.m_data.array.elementType = (VarType *)plVar10[1];
          *plVar10 = (long)plVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_148);
          local_120._0_8_ = (long)&local_120 + 0x10;
          plVar13 = plVar10 + 2;
          if ((long *)*plVar10 == plVar13) {
            local_120.m_data._8_8_ = *plVar13;
            lStack_108 = plVar10[3];
          }
          else {
            local_120.m_data._8_8_ = *plVar13;
            local_120._0_8_ = (long *)*plVar10;
          }
          uVar5 = local_120._0_8_;
          local_120.m_data.array.elementType = (VarType *)plVar10[1];
          *plVar10 = (long)plVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          deqp::gls::ub::VarType::VarType(&local_90,DVar1,4);
          createBlockBasicTypeCases
                    ((TestCaseGroup *)local_128,pCVar2,(char *)uVar5,&local_90,
                     *(uint *)((long)&init::matrixFlags[0].flags + lVar16) | uVar18,3);
          deqp::gls::ub::VarType::~VarType(&local_90);
          if (local_120._0_8_ != (long)&local_120 + 0x10U) {
            operator_delete((void *)local_120._0_8_,local_120.m_data._8_8_ + 1);
          }
          if (local_148._0_8_ != (long)&local_148 + 0x10U) {
            operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,local_a8 + 1);
          }
          lVar16 = lVar16 + 0x10;
        } while (lVar16 == 0x10);
      }
      pTVar7 = local_e8;
      pTVar6 = (TestNode *)((long)&local_f8->_vptr_TestNode + 1);
    } while (pTVar6 != (TestNode *)0x19);
    paVar9 = (anon_struct_16_2_f7718127 *)((long)&local_d8->name + 1);
    pTVar6 = local_e8;
  } while (paVar9 != (anon_struct_16_2_f7718127 *)0x3);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar7->m_testCtx,"multi_basic_types",
             "Multiple buffers with basic types");
  tcu::TestNode::addChild(pTVar7,pTVar6);
  lVar16 = 0;
  local_c0 = pTVar6;
  do {
    pTVar8 = (TestNode *)operator_new(0x70);
    local_70 = lVar16;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar7->m_testCtx,init::bufferModes[lVar16].name,
               glcts::fixed_sample_locations_values + 1);
    local_d0 = (TestNode *)(init::bufferModes + lVar16);
    local_100 = pTVar8;
    tcu::TestNode::addChild(pTVar6,pTVar8);
    pTVar8 = (TestNode *)0x0;
    do {
      local_e0 = (TestNode *)(init::layoutFlags + (long)pTVar8);
      local_d8 = (anon_struct_16_2_f7718127 *)init::layoutFlags[(long)pTVar8].name;
      local_f0 = (TestNode *)CONCAT44(local_f0._4_4_,1);
      local_c8 = pTVar8;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,(char *)local_d8,(allocator<char> *)&local_148);
        local_128 = (TestNode *)CONCAT44(local_128._4_4_,*(deUint32 *)&local_e0->m_testCtx);
        if ((int)local_f0 != 1) {
          std::__cxx11::string::append((char *)&local_120);
        }
        pUVar12 = (UniformBlockCase *)operator_new(0xc0);
        pp_Var3 = local_e8[1]._vptr_TestNode;
        local_148._0_8_ = (long)&local_148 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_120._0_8_,
                   (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type));
        std::__cxx11::string::append((char *)&local_148);
        bVar19 = (int)local_f0 != 1;
        local_f8 = (TestNode *)CONCAT44(local_f8._4_4_,*(BufferMode *)&local_d0->m_testCtx);
        deqp::gls::UniformBlockCase::UniformBlockCase
                  (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                   (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                   GLSL_VERSION_300_ES,*(BufferMode *)&local_d0->m_testCtx);
        uVar18 = (uint)local_128 | 0x100;
        iVar17 = (uint)bVar19 * 3;
        (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_0217d1e8;
        *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode = uVar18;
        *(uint *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar18;
        *(int *)&pUVar12[1].super_TestCase.super_TestNode.m_testCtx = iVar17;
        tcu::TestNode::addChild(local_100,(TestNode *)pUVar12);
        if (local_148._0_8_ != (long)&local_148 + 0x10U) {
          operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
        }
        pUVar12 = (UniformBlockCase *)operator_new(0xc0);
        pp_Var3 = local_e8[1]._vptr_TestNode;
        local_148._0_8_ = (long)&local_148 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_120._0_8_,
                   (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type));
        std::__cxx11::string::append((char *)&local_148);
        deqp::gls::UniformBlockCase::UniformBlockCase
                  (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                   (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                   GLSL_VERSION_300_ES,(BufferMode)local_f8);
        uVar15 = (uint)local_128 | 0x200;
        (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_0217d1e8;
        *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode = uVar15;
        *(uint *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar15;
        *(int *)&pUVar12[1].super_TestCase.super_TestNode.m_testCtx = iVar17;
        tcu::TestNode::addChild(local_100,(TestNode *)pUVar12);
        if (local_148._0_8_ != (long)&local_148 + 0x10U) {
          operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
        }
        if (((ulong)local_128 & 0x10) == 0) {
          pUVar12 = (UniformBlockCase *)operator_new(0xc0);
          pp_Var3 = local_e8[1]._vptr_TestNode;
          local_148._0_8_ = (long)&local_148 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_120._0_8_,
                     (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_148);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                     (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                     GLSL_VERSION_300_ES,(BufferMode)local_f8);
          (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0217d1e8;
          *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_128 | 0x300;
          *(uint *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
               (uint)local_128 | 0x300;
          *(int *)&pUVar12[1].super_TestCase.super_TestNode.m_testCtx = iVar17;
          tcu::TestNode::addChild(local_100,(TestNode *)pUVar12);
          if (local_148._0_8_ != (long)&local_148 + 0x10U) {
            operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
          }
        }
        pUVar12 = (UniformBlockCase *)operator_new(0xc0);
        pp_Var3 = local_e8[1]._vptr_TestNode;
        local_148._0_8_ = (long)&local_148 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_120._0_8_,
                   (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type));
        std::__cxx11::string::append((char *)&local_148);
        deqp::gls::UniformBlockCase::UniformBlockCase
                  (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                   (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                   GLSL_VERSION_300_ES,(BufferMode)local_f8);
        (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_0217d1e8;
        *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode = uVar18;
        *(uint *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar15;
        *(int *)&pUVar12[1].super_TestCase.super_TestNode.m_testCtx = iVar17;
        tcu::TestNode::addChild(local_100,(TestNode *)pUVar12);
        if (local_148._0_8_ != (long)&local_148 + 0x10U) {
          operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
        }
        pTVar6 = local_c0;
        pTVar7 = local_e8;
        if (local_120._0_8_ != (long)&local_120 + 0x10U) {
          operator_delete((void *)local_120._0_8_,local_120.m_data._8_8_ + 1);
        }
        iVar17 = (int)local_f0 + -1;
        local_f0 = (TestNode *)CONCAT44(local_f0._4_4_,iVar17);
      } while (iVar17 == 0);
      pTVar8 = (TestNode *)((long)&local_c8->_vptr_TestNode + 1);
    } while (pTVar8 != (TestNode *)0x3);
    lVar16 = local_70 + 1;
  } while (local_70 == 0);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar7->m_testCtx,"multi_nested_struct",
             "Multiple buffers with nested structs");
  tcu::TestNode::addChild(pTVar7,pTVar6);
  lVar16 = 0;
  local_c0 = pTVar6;
  do {
    pTVar8 = (TestNode *)operator_new(0x70);
    local_70 = lVar16;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar7->m_testCtx,init::bufferModes[lVar16].name,
               glcts::fixed_sample_locations_values + 1);
    local_d0 = (TestNode *)(init::bufferModes + lVar16);
    local_100 = pTVar8;
    tcu::TestNode::addChild(pTVar6,pTVar8);
    pTVar8 = (TestNode *)0x0;
    do {
      local_e0 = (TestNode *)(init::layoutFlags + (long)pTVar8);
      local_d8 = (anon_struct_16_2_f7718127 *)init::layoutFlags[(long)pTVar8].name;
      local_f0 = (TestNode *)CONCAT44(local_f0._4_4_,1);
      local_c8 = pTVar8;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,(char *)local_d8,(allocator<char> *)&local_148);
        local_128 = (TestNode *)CONCAT44(local_128._4_4_,*(deUint32 *)&local_e0->m_testCtx);
        if ((int)local_f0 != 1) {
          std::__cxx11::string::append((char *)&local_120);
        }
        pUVar12 = (UniformBlockCase *)operator_new(0xc0);
        pp_Var3 = local_e8[1]._vptr_TestNode;
        local_148._0_8_ = (long)&local_148 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_120._0_8_,
                   (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type));
        std::__cxx11::string::append((char *)&local_148);
        bVar19 = (int)local_f0 != 1;
        local_f8 = (TestNode *)CONCAT44(local_f8._4_4_,*(BufferMode *)&local_d0->m_testCtx);
        deqp::gls::UniformBlockCase::UniformBlockCase
                  (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                   (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                   GLSL_VERSION_300_ES,*(BufferMode *)&local_d0->m_testCtx);
        uVar18 = (uint)local_128 | 0x100;
        iVar17 = (uint)bVar19 * 3;
        (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_0217d238;
        *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode = uVar18;
        *(uint *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar18;
        *(int *)&pUVar12[1].super_TestCase.super_TestNode.m_testCtx = iVar17;
        tcu::TestNode::addChild(local_100,(TestNode *)pUVar12);
        if (local_148._0_8_ != (long)&local_148 + 0x10U) {
          operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
        }
        pUVar12 = (UniformBlockCase *)operator_new(0xc0);
        pp_Var3 = local_e8[1]._vptr_TestNode;
        local_148._0_8_ = (long)&local_148 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_120._0_8_,
                   (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type));
        std::__cxx11::string::append((char *)&local_148);
        deqp::gls::UniformBlockCase::UniformBlockCase
                  (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                   (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                   GLSL_VERSION_300_ES,(BufferMode)local_f8);
        uVar15 = (uint)local_128 | 0x200;
        (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_0217d238;
        *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode = uVar15;
        *(uint *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar15;
        *(int *)&pUVar12[1].super_TestCase.super_TestNode.m_testCtx = iVar17;
        tcu::TestNode::addChild(local_100,(TestNode *)pUVar12);
        if (local_148._0_8_ != (long)&local_148 + 0x10U) {
          operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
        }
        if (((ulong)local_128 & 0x10) == 0) {
          pUVar12 = (UniformBlockCase *)operator_new(0xc0);
          pp_Var3 = local_e8[1]._vptr_TestNode;
          local_148._0_8_ = (long)&local_148 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_120._0_8_,
                     (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type)
                    );
          std::__cxx11::string::append((char *)&local_148);
          deqp::gls::UniformBlockCase::UniformBlockCase
                    (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                     (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                     GLSL_VERSION_300_ES,(BufferMode)local_f8);
          (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0217d238;
          *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_128 | 0x300;
          *(uint *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
               (uint)local_128 | 0x300;
          *(int *)&pUVar12[1].super_TestCase.super_TestNode.m_testCtx = iVar17;
          tcu::TestNode::addChild(local_100,(TestNode *)pUVar12);
          if (local_148._0_8_ != (long)&local_148 + 0x10U) {
            operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
          }
        }
        pUVar12 = (UniformBlockCase *)operator_new(0xc0);
        pp_Var3 = local_e8[1]._vptr_TestNode;
        local_148._0_8_ = (long)&local_148 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_120._0_8_,
                   (char *)(local_120._0_8_ + (long)&(local_120.m_data.array.elementType)->m_type));
        std::__cxx11::string::append((char *)&local_148);
        deqp::gls::UniformBlockCase::UniformBlockCase
                  (pUVar12,(TestContext *)*pp_Var3,(RenderContext *)pp_Var3[1],
                   (char *)local_148._0_8_,glcts::fixed_sample_locations_values + 1,
                   GLSL_VERSION_300_ES,(BufferMode)local_f8);
        (pUVar12->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_0217d238;
        *(uint *)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode = uVar18;
        *(uint *)((long)&pUVar12[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar15;
        *(int *)&pUVar12[1].super_TestCase.super_TestNode.m_testCtx = iVar17;
        tcu::TestNode::addChild(local_100,(TestNode *)pUVar12);
        if (local_148._0_8_ != (long)&local_148 + 0x10U) {
          operator_delete((void *)local_148._0_8_,local_148.m_data._8_8_ + 1);
        }
        pTVar6 = local_c0;
        pTVar7 = local_e8;
        if (local_120._0_8_ != (long)&local_120 + 0x10U) {
          operator_delete((void *)local_120._0_8_,local_120.m_data._8_8_ + 1);
        }
        iVar17 = (int)local_f0 + -1;
        local_f0 = (TestNode *)CONCAT44(local_f0._4_4_,iVar17);
      } while (iVar17 == 0);
      pTVar8 = (TestNode *)((long)&local_c8->_vptr_TestNode + 1);
    } while (pTVar8 != (TestNode *)0x3);
    lVar16 = local_70 + 1;
  } while (local_70 == 0);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar7->m_testCtx,"random","Random Uniform Block cases");
  tcu::TestNode::addChild(pTVar7,pTVar6);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,"scalar_types",
             "Scalar types only, per-block buffers",BUFFERMODE_PER_BLOCK,0x3fc0,0x19,0);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,"vector_types",
             "Scalar and vector types only, per-block buffers",BUFFERMODE_PER_BLOCK,0x3fc1,0x19,0x19
            );
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,"basic_types",
             "All basic types, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fc3,0x19,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,"basic_arrays",
             "Arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fc7,0x19,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,"basic_instance_arrays",
             "Basic instance arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fe3,0x19,0x4b);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,"nested_structs",
             "Nested structs, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fcb,0x19,100);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,"nested_structs_arrays",
             "Nested structs, arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fcf,0x19,0x96);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,
             "nested_structs_instance_arrays","Nested structs, instance arrays, per-block buffers",
             BUFFERMODE_PER_BLOCK,0x7feb,0x19,0x7d);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,
             "nested_structs_arrays_instance_arrays",
             "Nested structs, instance arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fef,0x19,
             0xaf);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,"all_per_block_buffers",
             "All random features, per-block buffers",BUFFERMODE_PER_BLOCK,0xffff7fff,0x32,200);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar6,(Context *)pTVar7[1]._vptr_TestNode,"all_shared_buffer",
             "All random features, shared buffer",BUFFERMODE_SINGLE,0xffff7fff,0x32,0xfa);
  return extraout_EAX;
}

Assistant:

void UniformBlockTests::init (void)
{
	static const glu::DataType basicTypes[] =
	{
		glu::TYPE_FLOAT,
		glu::TYPE_FLOAT_VEC2,
		glu::TYPE_FLOAT_VEC3,
		glu::TYPE_FLOAT_VEC4,
		glu::TYPE_INT,
		glu::TYPE_INT_VEC2,
		glu::TYPE_INT_VEC3,
		glu::TYPE_INT_VEC4,
		glu::TYPE_UINT,
		glu::TYPE_UINT_VEC2,
		glu::TYPE_UINT_VEC3,
		glu::TYPE_UINT_VEC4,
		glu::TYPE_BOOL,
		glu::TYPE_BOOL_VEC2,
		glu::TYPE_BOOL_VEC3,
		glu::TYPE_BOOL_VEC4,
		glu::TYPE_FLOAT_MAT2,
		glu::TYPE_FLOAT_MAT3,
		glu::TYPE_FLOAT_MAT4,
		glu::TYPE_FLOAT_MAT2X3,
		glu::TYPE_FLOAT_MAT2X4,
		glu::TYPE_FLOAT_MAT3X2,
		glu::TYPE_FLOAT_MAT3X4,
		glu::TYPE_FLOAT_MAT4X2,
		glu::TYPE_FLOAT_MAT4X3
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} precisionFlags[] =
	{
		{ "lowp",		PRECISION_LOW		},
		{ "mediump",	PRECISION_MEDIUM	},
		{ "highp",		PRECISION_HIGH		}
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} layoutFlags[] =
	{
		{ "shared",		LAYOUT_SHARED	},
		{ "packed",		LAYOUT_PACKED	},
		{ "std140",		LAYOUT_STD140	}
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} matrixFlags[] =
	{
		{ "row_major",		LAYOUT_ROW_MAJOR	},
		{ "column_major",	LAYOUT_COLUMN_MAJOR }
	};

	static const struct
	{
		const char*							name;
		UniformBlockCase::BufferMode		mode;
	} bufferModes[] =
	{
		{ "per_block_buffer",	UniformBlockCase::BUFFERMODE_PER_BLOCK },
		{ "single_buffer",		UniformBlockCase::BUFFERMODE_SINGLE	}
	};

	// ubo.single_basic_type
	{
		tcu::TestCaseGroup* singleBasicTypeGroup = new tcu::TestCaseGroup(m_testCtx, "single_basic_type", "Single basic variable in single buffer");
		addChild(singleBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*		typeName	= glu::getDataTypeName(type);

				if (glu::isDataTypeBoolOrBVec(type))
					createBlockBasicTypeCases(layoutGroup, m_context, typeName, VarType(type, 0), layoutFlags[layoutFlagNdx].flags);
				else
				{
					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(precisionFlags[precNdx].name) + "_" + typeName).c_str(),
												  VarType(type, precisionFlags[precNdx].flags), layoutFlags[layoutFlagNdx].flags);
				}

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
					{
						for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
							createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + precisionFlags[precNdx].name + "_" + typeName).c_str(),
													  VarType(type, precisionFlags[precNdx].flags), layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
					}
				}
			}
		}
	}

	// ubo.single_basic_array
	{
		tcu::TestCaseGroup* singleBasicArrayGroup = new tcu::TestCaseGroup(m_testCtx, "single_basic_array", "Single basic array variable in single buffer");
		addChild(singleBasicArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*		typeName	= glu::getDataTypeName(type);
				const int		arraySize	= 3;

				createBlockBasicTypeCases(layoutGroup, m_context, typeName,
										  VarType(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), arraySize),
										  layoutFlags[layoutFlagNdx].flags);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  VarType(VarType(type, PRECISION_HIGH), arraySize),
												  layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
				}
			}
		}
	}

	// ubo.single_struct
	{
		tcu::TestCaseGroup* singleStructGroup = new tcu::TestCaseGroup(m_testCtx, "single_struct", "Single struct in uniform block");
		addChild(singleStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleStructCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleStructCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleStructCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_struct_array
	{
		tcu::TestCaseGroup* singleStructArrayGroup = new tcu::TestCaseGroup(m_testCtx, "single_struct_array", "Struct array in one uniform block");
		addChild(singleStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleStructArrayGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleStructArrayCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleStructArrayCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleStructArrayCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct
	{
		tcu::TestCaseGroup* singleNestedStructGroup = new tcu::TestCaseGroup(m_testCtx, "single_nested_struct", "Nested struct in one uniform block");
		addChild(singleNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleNestedStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleNestedStructCase(m_context, (baseName + "_vertex").c_str(),		"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleNestedStructCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleNestedStructCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct_array
	{
		tcu::TestCaseGroup* singleNestedStructArrayGroup = new tcu::TestCaseGroup(m_testCtx, "single_nested_struct_array", "Nested struct array in one uniform block");
		addChild(singleNestedStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleNestedStructArrayGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleNestedStructArrayCase(m_context, (baseName + "_vertex").c_str(),		"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleNestedStructArrayCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleNestedStructArrayCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.instance_array_basic_type
	{
		tcu::TestCaseGroup* instanceArrayBasicTypeGroup = new tcu::TestCaseGroup(m_testCtx, "instance_array_basic_type", "Single basic variable in instance array");
		addChild(instanceArrayBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			instanceArrayBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType	type			= basicTypes[basicTypeNdx];
				const char*		typeName		= glu::getDataTypeName(type);
				const int		numInstances	= 3;

				createBlockBasicTypeCases(layoutGroup, m_context, typeName,
										  VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH),
										  layoutFlags[layoutFlagNdx].flags, numInstances);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  VarType(type, PRECISION_HIGH), layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags,
												  numInstances);
				}
			}
		}
	}

	// ubo.multi_basic_types
	{
		tcu::TestCaseGroup* multiBasicTypesGroup = new tcu::TestCaseGroup(m_testCtx, "multi_basic_types", "Multiple buffers with basic types");
		addChild(multiBasicTypesGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiBasicTypesGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_vertex").c_str(),		"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));

					modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_mixed").c_str(),		"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.multi_nested_struct
	{
		tcu::TestCaseGroup* multiNestedStructGroup = new tcu::TestCaseGroup(m_testCtx, "multi_nested_struct", "Multiple buffers with nested structs");
		addChild(multiNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiNestedStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));

					modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_mixed").c_str(),	"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.random
	{
		const deUint32	allShaders		= FEATURE_VERTEX_BLOCKS|FEATURE_FRAGMENT_BLOCKS|FEATURE_SHARED_BLOCKS;
		const deUint32	allLayouts		= FEATURE_PACKED_LAYOUT|FEATURE_SHARED_LAYOUT|FEATURE_STD140_LAYOUT;
		const deUint32	allBasicTypes	= FEATURE_VECTORS|FEATURE_MATRICES;
		const deUint32	unused			= FEATURE_UNUSED_MEMBERS|FEATURE_UNUSED_UNIFORMS;
		const deUint32	matFlags		= FEATURE_MATRIX_LAYOUT;
		const deUint32	allFeatures		= ~FEATURE_ARRAYS_OF_ARRAYS;

		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random Uniform Block cases");
		addChild(randomGroup);

		// Basic types.
		createRandomCaseGroup(randomGroup, m_context, "scalar_types",	"Scalar types only, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused,										25, 0);
		createRandomCaseGroup(randomGroup, m_context, "vector_types",	"Scalar and vector types only, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|FEATURE_VECTORS,						25, 25);
		createRandomCaseGroup(randomGroup, m_context, "basic_types",	"All basic types, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK, allShaders|allLayouts|unused|allBasicTypes|matFlags,				25, 50);
		createRandomCaseGroup(randomGroup, m_context, "basic_arrays",	"Arrays, per-block buffers",						UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_ARRAYS,	25, 50);

		createRandomCaseGroup(randomGroup, m_context, "basic_instance_arrays",					"Basic instance arrays, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_INSTANCE_ARRAYS,								25, 75);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs",							"Nested structs, per-block buffers",					UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS,										25, 100);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_arrays",					"Nested structs, arrays, per-block buffers",			UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS|FEATURE_ARRAYS,							25, 150);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_instance_arrays",			"Nested structs, instance arrays, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS|FEATURE_INSTANCE_ARRAYS,				25, 125);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_arrays_instance_arrays",	"Nested structs, instance arrays, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS|FEATURE_ARRAYS|FEATURE_INSTANCE_ARRAYS,	25, 175);

		createRandomCaseGroup(randomGroup, m_context, "all_per_block_buffers",	"All random features, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allFeatures,	50, 200);
		createRandomCaseGroup(randomGroup, m_context, "all_shared_buffer",		"All random features, shared buffer",		UniformBlockCase::BUFFERMODE_SINGLE,	allFeatures,	50, 250);
	}
}